

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  SourceLineInfo *__s;
  char *__s_00;
  IMutableRegistryHub *pIVar1;
  allocator<char> local_81;
  string local_80 [39];
  allocator<char> local_59;
  string local_58 [48];
  SourceLineInfo *local_28;
  SourceLineInfo *lineInfo_local;
  char *tag_local;
  char *alias_local;
  RegistrarForTagAliases *this_local;
  
  local_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)tag;
  tag_local = alias;
  alias_local = (char *)this;
  pIVar1 = getMutableRegistryHub();
  __s_00 = tag_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,__s_00,&local_59);
  __s = lineInfo_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,(char *)__s,&local_81);
  (*pIVar1->_vptr_IMutableRegistryHub[6])(pIVar1,local_58,local_80,local_28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases(char const* alias, char const* tag, SourceLineInfo const& lineInfo) {
        CATCH_TRY {
            getMutableRegistryHub().registerTagAlias(alias, tag, lineInfo);
        }